

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O1

bool __thiscall SkipList::insertElement(SkipList *this,int value)

{
  int iVar1;
  Element *pEVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Element *pEVar6;
  ulong uVar7;
  Element *pEVar8;
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> update;
  allocator_type local_49;
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> local_48;
  
  std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::vector
            (&local_48,(long)this->MAX_HEIGHT + 1,&local_49);
  pEVar6 = &this->head;
  lVar5 = (long)this->height;
  pEVar8 = pEVar6;
  pEVar2 = pEVar6;
  if (-1 < lVar5) {
    do {
      do {
        pEVar8 = pEVar2;
        pEVar2 = (pEVar8->next).
                 super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5];
      } while (pEVar2->value < value);
      local_48.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl
      .super__Vector_impl_data._M_start[lVar5] = pEVar8;
      bVar3 = 0 < lVar5;
      pEVar2 = pEVar8;
      lVar5 = lVar5 + -1;
    } while (bVar3);
  }
  iVar1 = (*(pEVar8->next).
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start)->value;
  if (iVar1 != value) {
    iVar4 = randomHeight(this);
    lVar5 = (long)this->height;
    if (this->height < iVar4) {
      do {
        local_48.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar5 + 1] = pEVar6;
        lVar5 = lVar5 + 1;
      } while (iVar4 != lVar5);
      this->height = iVar4;
    }
    pEVar6 = (Element *)operator_new(0x20);
    pEVar6->value = value;
    std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::vector
              (&pEVar6->next,(long)iVar4 + 1,&local_49);
    if (-1 < iVar4) {
      uVar7 = 0;
      do {
        *(Element **)
         (*(long *)&(pEVar6->next).
                    super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
                    _M_impl.super__Vector_impl_data + uVar7 * 8) =
             (local_48.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7]->next).
             super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
        (local_48.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar7]->next).
        super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = pEVar6;
        uVar7 = uVar7 + 1;
      } while (iVar4 + 1 != uVar7);
    }
  }
  if (local_48.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar1 != value;
}

Assistant:

bool SkipList::insertElement(int value) {
    std::vector<Element *> update((unsigned long long) (MAX_HEIGHT + 1));
    Element *p = &head;

    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
        update[i] = p;
    }
    p = p->next[0];

    if (p->value == value) {
        return false;    // key x exists already in list
    }

    int new_height = randomHeight();
    if (new_height > height) {  // link new Element to head, adjust list height
        for (int i = height + 1; i <= new_height; ++i) {
            update[i] = &head;
        }
        height = new_height;
    }

    // create new Element with height new_height and key x
    p = new Element(value, new_height);

    // insert p into level i lists immediately after Element update[i]
    for (int i = 0; i <= new_height; ++i) {
        p->next[i] = update[i]->next[i];
        update[i]->next[i] = p;
    }
    return true;
}